

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O3

void send_multiple_test(void)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  int j;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int count;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  int iVar52;
  undefined1 auVar49 [16];
  int iVar53;
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  int iVar71;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  PortMidiStream *midi_out;
  uchar msg [1024];
  undefined8 local_420;
  byte local_418 [6];
  byte abStack_412 [1018];
  
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  puts("This is for performance testing. You should be sending to this");
  puts("program running the receive multiple test. Do NOT send to");
  puts("a synthesizer or you risk reprogramming it");
  iVar24 = get_number("Type output device number: ");
  do {
    latency = get_number(
                        "Latency in milliseconds (0 to send data immediatedly,\n  >0 to send timestamped messages): "
                        );
  } while (latency < 0);
  Pm_OpenOutput((PortMidiStream **)&local_420,iVar24,(void *)0x0,0,(PmTimeProcPtr)0x0,(void *)0x0,
                latency);
  do {
    uVar25 = get_number("Message length (7 - 1024): ");
  } while (uVar25 - 0x401 < 0xfffffc06);
  do {
    uVar26 = get_number("Number of messages: ");
  } while ((int)uVar26 < 1);
  local_418[0] = 0xf0;
  if (7 < (int)uVar25) {
    lVar27 = (ulong)uVar25 - 8;
    auVar29._8_4_ = (int)lVar27;
    auVar29._0_8_ = lVar27;
    auVar29._12_4_ = (int)((ulong)lVar27 >> 0x20);
    uVar28 = 0;
    do {
      auVar47._8_4_ = (int)uVar28;
      auVar47._0_8_ = uVar28;
      auVar47._12_4_ = (int)(uVar28 >> 0x20);
      auVar49 = auVar29 ^ _DAT_00108090;
      auVar54 = (auVar47 | _DAT_00108080) ^ _DAT_00108090;
      iVar24 = auVar49._0_4_;
      iVar67 = -(uint)(iVar24 < auVar54._0_4_);
      iVar51 = auVar49._4_4_;
      auVar56._4_4_ = -(uint)(iVar51 < auVar54._4_4_);
      iVar52 = auVar49._8_4_;
      iVar71 = -(uint)(iVar52 < auVar54._8_4_);
      iVar53 = auVar49._12_4_;
      auVar56._12_4_ = -(uint)(iVar53 < auVar54._12_4_);
      auVar30._4_4_ = iVar67;
      auVar30._0_4_ = iVar67;
      auVar30._8_4_ = iVar71;
      auVar30._12_4_ = iVar71;
      auVar30 = pshuflw(in_XMM1,auVar30,0xe8);
      auVar55._4_4_ = -(uint)(auVar54._4_4_ == iVar51);
      auVar55._12_4_ = -(uint)(auVar54._12_4_ == iVar53);
      auVar55._0_4_ = auVar55._4_4_;
      auVar55._8_4_ = auVar55._12_4_;
      auVar39 = pshuflw(in_XMM2,auVar55,0xe8);
      auVar56._0_4_ = auVar56._4_4_;
      auVar56._8_4_ = auVar56._12_4_;
      auVar54 = pshuflw(auVar30,auVar56,0xe8);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar54 | auVar39 & auVar30) ^ auVar49;
      auVar49 = packssdw(auVar49,auVar49);
      bVar23 = (byte)uVar28;
      if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        abStack_412[uVar28] = bVar23 & 0x70 | 6;
      }
      auVar39._4_4_ = iVar67;
      auVar39._0_4_ = iVar67;
      auVar39._8_4_ = iVar71;
      auVar39._12_4_ = iVar71;
      auVar56 = auVar55 & auVar39 | auVar56;
      auVar49 = packssdw(auVar56,auVar56);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 ^ auVar54,auVar49 ^ auVar54);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._0_4_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 1] = bVar23 & 0x70 | 7;
      }
      auVar49 = (auVar47 | _DAT_00108070) ^ _DAT_00108090;
      auVar40._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar40._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar40._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar40._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar57._4_4_ = auVar40._0_4_;
      auVar57._0_4_ = auVar40._0_4_;
      auVar57._8_4_ = auVar40._8_4_;
      auVar57._12_4_ = auVar40._8_4_;
      iVar67 = -(uint)(auVar49._4_4_ == iVar51);
      iVar71 = -(uint)(auVar49._12_4_ == iVar53);
      auVar11._4_4_ = iVar67;
      auVar11._0_4_ = iVar67;
      auVar11._8_4_ = iVar71;
      auVar11._12_4_ = iVar71;
      auVar68._4_4_ = auVar40._4_4_;
      auVar68._0_4_ = auVar40._4_4_;
      auVar68._8_4_ = auVar40._12_4_;
      auVar68._12_4_ = auVar40._12_4_;
      auVar49 = auVar11 & auVar57 | auVar68;
      auVar49 = packssdw(auVar49,auVar49);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 ^ auVar2,auVar49 ^ auVar2);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._0_4_ >> 0x10 & 1) != 0) {
        abStack_412[uVar28 + 2] = bVar23 & 0x70 | 8;
      }
      auVar49 = pshufhw(auVar49,auVar57,0x84);
      auVar12._4_4_ = iVar67;
      auVar12._0_4_ = iVar67;
      auVar12._8_4_ = iVar71;
      auVar12._12_4_ = iVar71;
      auVar54 = pshufhw(auVar40,auVar12,0x84);
      auVar30 = pshufhw(auVar49,auVar68,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar30 | auVar54 & auVar49) ^ auVar31;
      auVar49 = packssdw(auVar31,auVar31);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._0_4_ >> 0x18 & 1) != 0) {
        abStack_412[uVar28 + 3] = bVar23 & 0x70 | 9;
      }
      auVar49 = (auVar47 | _DAT_00108060) ^ _DAT_00108090;
      auVar41._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar41._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar41._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar41._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar13._4_4_ = auVar41._0_4_;
      auVar13._0_4_ = auVar41._0_4_;
      auVar13._8_4_ = auVar41._8_4_;
      auVar13._12_4_ = auVar41._8_4_;
      auVar54 = pshuflw(auVar68,auVar13,0xe8);
      auVar32._0_4_ = -(uint)(auVar49._0_4_ == iVar24);
      auVar32._4_4_ = -(uint)(auVar49._4_4_ == iVar51);
      auVar32._8_4_ = -(uint)(auVar49._8_4_ == iVar52);
      auVar32._12_4_ = -(uint)(auVar49._12_4_ == iVar53);
      auVar58._4_4_ = auVar32._4_4_;
      auVar58._0_4_ = auVar32._4_4_;
      auVar58._8_4_ = auVar32._12_4_;
      auVar58._12_4_ = auVar32._12_4_;
      auVar49 = pshuflw(auVar32,auVar58,0xe8);
      auVar59._4_4_ = auVar41._4_4_;
      auVar59._0_4_ = auVar41._4_4_;
      auVar59._8_4_ = auVar41._12_4_;
      auVar59._12_4_ = auVar41._12_4_;
      auVar30 = pshuflw(auVar41,auVar59,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 & auVar54,(auVar30 | auVar49 & auVar54) ^ auVar3);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        abStack_412[uVar28 + 4] = bVar23 & 0x70 | 10;
      }
      auVar14._4_4_ = auVar41._0_4_;
      auVar14._0_4_ = auVar41._0_4_;
      auVar14._8_4_ = auVar41._8_4_;
      auVar14._12_4_ = auVar41._8_4_;
      auVar59 = auVar58 & auVar14 | auVar59;
      auVar30 = packssdw(auVar59,auVar59);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49,auVar30 ^ auVar4);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._4_2_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 5] = bVar23 & 0x70 | 0xb;
      }
      auVar49 = (auVar47 | _DAT_00108050) ^ _DAT_00108090;
      auVar42._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar42._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar42._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar42._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar60._4_4_ = auVar42._0_4_;
      auVar60._0_4_ = auVar42._0_4_;
      auVar60._8_4_ = auVar42._8_4_;
      auVar60._12_4_ = auVar42._8_4_;
      iVar67 = -(uint)(auVar49._4_4_ == iVar51);
      iVar71 = -(uint)(auVar49._12_4_ == iVar53);
      auVar15._4_4_ = iVar67;
      auVar15._0_4_ = iVar67;
      auVar15._8_4_ = iVar71;
      auVar15._12_4_ = iVar71;
      auVar69._4_4_ = auVar42._4_4_;
      auVar69._0_4_ = auVar42._4_4_;
      auVar69._8_4_ = auVar42._12_4_;
      auVar69._12_4_ = auVar42._12_4_;
      auVar49 = auVar15 & auVar60 | auVar69;
      auVar49 = packssdw(auVar49,auVar49);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 ^ auVar5,auVar49 ^ auVar5);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        abStack_412[uVar28 + 6] = bVar23 & 0x70 | 0xc;
      }
      auVar49 = pshufhw(auVar49,auVar60,0x84);
      auVar16._4_4_ = iVar67;
      auVar16._0_4_ = iVar67;
      auVar16._8_4_ = iVar71;
      auVar16._12_4_ = iVar71;
      auVar54 = pshufhw(auVar42,auVar16,0x84);
      auVar30 = pshufhw(auVar49,auVar69,0x84);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = (auVar30 | auVar54 & auVar49) ^ auVar33;
      auVar49 = packssdw(auVar33,auVar33);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._6_2_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 7] = bVar23 & 0x70 | 0xd;
      }
      auVar49 = (auVar47 | _DAT_00108040) ^ _DAT_00108090;
      auVar43._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar43._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar43._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar43._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar17._4_4_ = auVar43._0_4_;
      auVar17._0_4_ = auVar43._0_4_;
      auVar17._8_4_ = auVar43._8_4_;
      auVar17._12_4_ = auVar43._8_4_;
      auVar54 = pshuflw(auVar69,auVar17,0xe8);
      auVar34._0_4_ = -(uint)(auVar49._0_4_ == iVar24);
      auVar34._4_4_ = -(uint)(auVar49._4_4_ == iVar51);
      auVar34._8_4_ = -(uint)(auVar49._8_4_ == iVar52);
      auVar34._12_4_ = -(uint)(auVar49._12_4_ == iVar53);
      auVar61._4_4_ = auVar34._4_4_;
      auVar61._0_4_ = auVar34._4_4_;
      auVar61._8_4_ = auVar34._12_4_;
      auVar61._12_4_ = auVar34._12_4_;
      auVar49 = pshuflw(auVar34,auVar61,0xe8);
      auVar62._4_4_ = auVar43._4_4_;
      auVar62._0_4_ = auVar43._4_4_;
      auVar62._8_4_ = auVar43._12_4_;
      auVar62._12_4_ = auVar43._12_4_;
      auVar30 = pshuflw(auVar43,auVar62,0xe8);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar30 | auVar49 & auVar54) ^ auVar44;
      auVar30 = packssdw(auVar44,auVar44);
      auVar49 = packsswb(auVar49 & auVar54,auVar30);
      if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        abStack_412[uVar28 + 8] = bVar23 & 0x70 | 0xe;
      }
      auVar18._4_4_ = auVar43._0_4_;
      auVar18._0_4_ = auVar43._0_4_;
      auVar18._8_4_ = auVar43._8_4_;
      auVar18._12_4_ = auVar43._8_4_;
      auVar62 = auVar61 & auVar18 | auVar62;
      auVar30 = packssdw(auVar62,auVar62);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar30 = packssdw(auVar30 ^ auVar6,auVar30 ^ auVar6);
      auVar49 = packsswb(auVar49,auVar30);
      if ((auVar49._8_2_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 9] = bVar23 & 0x70 | 0xf;
      }
      auVar49 = (auVar47 | _DAT_00108030) ^ _DAT_00108090;
      auVar45._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar45._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar45._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar45._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar63._4_4_ = auVar45._0_4_;
      auVar63._0_4_ = auVar45._0_4_;
      auVar63._8_4_ = auVar45._8_4_;
      auVar63._12_4_ = auVar45._8_4_;
      iVar67 = -(uint)(auVar49._4_4_ == iVar51);
      iVar71 = -(uint)(auVar49._12_4_ == iVar53);
      auVar19._4_4_ = iVar67;
      auVar19._0_4_ = iVar67;
      auVar19._8_4_ = iVar71;
      auVar19._12_4_ = iVar71;
      auVar70._4_4_ = auVar45._4_4_;
      auVar70._0_4_ = auVar45._4_4_;
      auVar70._8_4_ = auVar45._12_4_;
      auVar70._12_4_ = auVar45._12_4_;
      auVar49 = auVar19 & auVar63 | auVar70;
      auVar49 = packssdw(auVar49,auVar49);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 ^ auVar7,auVar49 ^ auVar7);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        abStack_412[uVar28 + 10] = bVar23 + 0x10 & 0x70;
      }
      auVar49 = pshufhw(auVar49,auVar63,0x84);
      auVar20._4_4_ = iVar67;
      auVar20._0_4_ = iVar67;
      auVar20._8_4_ = iVar71;
      auVar20._12_4_ = iVar71;
      auVar54 = pshufhw(auVar45,auVar20,0x84);
      auVar30 = pshufhw(auVar49,auVar70,0x84);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar30 | auVar54 & auVar49) ^ auVar35;
      auVar49 = packssdw(auVar35,auVar35);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._10_2_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 0xb] = bVar23 + 0x11 & 0x71;
      }
      auVar49 = (auVar47 | _DAT_00108020) ^ _DAT_00108090;
      auVar46._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar46._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar46._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar46._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar21._4_4_ = auVar46._0_4_;
      auVar21._0_4_ = auVar46._0_4_;
      auVar21._8_4_ = auVar46._8_4_;
      auVar21._12_4_ = auVar46._8_4_;
      auVar54 = pshuflw(auVar70,auVar21,0xe8);
      auVar36._0_4_ = -(uint)(auVar49._0_4_ == iVar24);
      auVar36._4_4_ = -(uint)(auVar49._4_4_ == iVar51);
      auVar36._8_4_ = -(uint)(auVar49._8_4_ == iVar52);
      auVar36._12_4_ = -(uint)(auVar49._12_4_ == iVar53);
      auVar64._4_4_ = auVar36._4_4_;
      auVar64._0_4_ = auVar36._4_4_;
      auVar64._8_4_ = auVar36._12_4_;
      auVar64._12_4_ = auVar36._12_4_;
      auVar49 = pshuflw(auVar36,auVar64,0xe8);
      auVar65._4_4_ = auVar46._4_4_;
      auVar65._0_4_ = auVar46._4_4_;
      auVar65._8_4_ = auVar46._12_4_;
      auVar65._12_4_ = auVar46._12_4_;
      auVar30 = pshuflw(auVar46,auVar65,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 & auVar54,(auVar30 | auVar49 & auVar54) ^ auVar8);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        abStack_412[uVar28 + 0xc] = bVar23 + 0x12 & 0x72;
      }
      auVar22._4_4_ = auVar46._0_4_;
      auVar22._0_4_ = auVar46._0_4_;
      auVar22._8_4_ = auVar46._8_4_;
      auVar22._12_4_ = auVar46._8_4_;
      auVar65 = auVar64 & auVar22 | auVar65;
      auVar30 = packssdw(auVar65,auVar65);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49,auVar30 ^ auVar9);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49._12_2_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 0xd] = bVar23 + 0x13 & 0x73;
      }
      auVar49 = (auVar47 | _DAT_00108010) ^ _DAT_00108090;
      auVar37._0_4_ = -(uint)(iVar24 < auVar49._0_4_);
      auVar37._4_4_ = -(uint)(iVar51 < auVar49._4_4_);
      auVar37._8_4_ = -(uint)(iVar52 < auVar49._8_4_);
      auVar37._12_4_ = -(uint)(iVar53 < auVar49._12_4_);
      auVar66._4_4_ = auVar37._0_4_;
      auVar66._0_4_ = auVar37._0_4_;
      auVar66._8_4_ = auVar37._8_4_;
      auVar66._12_4_ = auVar37._8_4_;
      auVar48._4_4_ = -(uint)(auVar49._4_4_ == iVar51);
      auVar48._12_4_ = -(uint)(auVar49._12_4_ == iVar53);
      auVar48._0_4_ = auVar48._4_4_;
      auVar48._8_4_ = auVar48._12_4_;
      auVar50._4_4_ = auVar37._4_4_;
      auVar50._0_4_ = auVar37._4_4_;
      auVar50._8_4_ = auVar37._12_4_;
      auVar50._12_4_ = auVar37._12_4_;
      auVar30 = auVar48 & auVar66 | auVar50;
      auVar49 = packssdw(auVar37,auVar30);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar49 = packssdw(auVar49 ^ auVar10,auVar49 ^ auVar10);
      auVar49 = packsswb(auVar49,auVar49);
      if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        abStack_412[uVar28 + 0xe] = bVar23 + 0x14 & 0x74;
      }
      auVar49 = pshufhw(auVar49,auVar66,0x84);
      in_XMM2 = pshufhw(auVar30,auVar48,0x84);
      in_XMM2 = in_XMM2 & auVar49;
      auVar49 = pshufhw(auVar49,auVar50,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar49 | in_XMM2) ^ auVar38;
      auVar49 = packssdw(auVar38,auVar38);
      in_XMM1 = packsswb(auVar49,auVar49);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        abStack_412[uVar28 + 0xf] = bVar23 + 0x15 & 0x75;
      }
      uVar28 = uVar28 + 0x10;
    } while ((uVar25 + 8 & 0xff0) != uVar28);
  }
  local_418[(long)(int)uVar25 + -1] = 0xf7;
  Pt_Time();
  do {
    lVar27 = 1;
    uVar28 = (ulong)uVar26;
    do {
      local_418[lVar27] = (byte)uVar28 & 0x7f;
      uVar28 = uVar28 >> 7;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 6);
    Pm_WriteSysEx(local_420,0,local_418);
    bVar1 = 1 < (int)uVar26;
    uVar26 = uVar26 - 1;
  } while (bVar1);
  Pt_Time();
  Pm_Close(local_420);
  return;
}

Assistant:

void send_multiple_test()
{
    int outp;
    int length;
    int num_msgs;
    PmStream *midi_out;
    unsigned char msg[1024];
    int i;
    PtTimestamp start_time;
    PtTimestamp stop_time;

    Pt_Start(1, 0, 0);
    
    printf("This is for performance testing. You should be sending to this\n");
    printf("program running the receive multiple test. Do NOT send to\n");
    printf("a synthesizer or you risk reprogramming it\n");
    outp = get_number("Type output device number: ");
    while ((latency = get_number(
                     "Latency in milliseconds (0 to send data immediatedly,\n"
                     "  >0 to send timestamped messages): ")) < 0);
    Pm_OpenOutput(&midi_out, outp, NULL, 0, NULL, NULL, latency);
    while ((length = get_number("Message length (7 - 1024): ")) < 7 ||
           length > 1024) ;
    while ((num_msgs = get_number("Number of messages: ")) < 1);
    /* latency, length, and num_msgs should now all be valid */
    /* compose the message except for sequence number in first 5 bytes */
    msg[0] = (char) MIDI_SYSEX;
    for (i = 6; i < length - 1; i++) {
        msg[i] = i % 128; /* this is just filler */
    }
    msg[length - 1] = (char) MIDI_EOX;

    start_time = Pt_Time();
    /* send the messages */
    for (i = num_msgs; i > 0; i--) {
        /* insert sequence number into first 5 data bytes */
        /* sequence counts down to zero */
        int j;
        int count = i;
        /* 7 bits of message count i goes into each data byte */
        for (j = 1; j <= 5; j++) {
            msg[j] = count & 127;
            count >>= 7;
        }
        /* send the message */
        Pm_WriteSysEx(midi_out, 0, msg);
    }
    stop_time = Pt_Time();
    Pm_Close(midi_out);
    return;
}